

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplace_back<slang::ast::GenerateBlockSymbol_const&,int&>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,
          GenerateBlockSymbol *args,int *args_1)

{
  undefined8 in_RDX;
  int32_t index;
  Symbol *in_RSI;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_RDI;
  int *in_stack_00000028;
  GenerateBlockSymbol *in_stack_00000030;
  pointer in_stack_00000038;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_stack_00000040;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *this_00;
  pointer local_8;
  
  index = (int32_t)((ulong)in_RDX >> 0x20);
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::GenerateBlockSymbol_const&,int&>
                        (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  else {
    this_00 = in_RDI;
    end(in_RDI);
    slang::ast::HierarchicalReference::Element::Element((Element *)this_00,in_RSI,index);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }